

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c3dfile.cc
# Opt level: O2

ParameterInfo * __thiscall
C3DFile::readParameterInfo(ParameterInfo *__return_storage_ptr__,C3DFile *this,ifstream *datastream)

{
  Sint8 *pSVar1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  Uint8 *pUVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  long lStack_40;
  
  ParameterInfo::ParameterInfo(__return_storage_ptr__);
  std::istream::read((char *)datastream,(long)__return_storage_ptr__);
  if (__return_storage_ptr__->name != (char *)0x0) {
    __assert_fail("result.name == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xdc,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  cVar3 = __return_storage_ptr__->name_length;
  bVar10 = cVar3 < '\0';
  if (bVar10) {
    cVar3 = -cVar3;
    __return_storage_ptr__->name_length = cVar3;
  }
  __return_storage_ptr__->locked = bVar10;
  pcVar4 = (char *)operator_new__((long)cVar3 + 1);
  __return_storage_ptr__->name = pcVar4;
  std::istream::read((char *)datastream,(long)pcVar4);
  __return_storage_ptr__->name[__return_storage_ptr__->name_length] = '\0';
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->next_offset);
  pSVar1 = &__return_storage_ptr__->data_type;
  std::istream::read((char *)datastream,(long)pSVar1);
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->n_dimensions);
  bVar2 = __return_storage_ptr__->n_dimensions;
  uVar7 = (ulong)bVar2;
  if (7 < uVar7) {
    __assert_fail("result.n_dimensions <= 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0xed,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  pUVar5 = (Uint8 *)operator_new__(uVar7);
  __return_storage_ptr__->dimensions = pUVar5;
  if (bVar2 != 0) {
    uVar9 = 1;
    for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
      std::istream::read((char *)datastream,(long)(pUVar5 + uVar8));
      pUVar5 = __return_storage_ptr__->dimensions;
      uVar9 = uVar9 * pUVar5[uVar8];
      uVar7 = (ulong)__return_storage_ptr__->n_dimensions;
    }
    cVar3 = *pSVar1;
    if (cVar3 == -1) {
LAB_00109905:
      pvVar6 = operator_new__((ulong)uVar9);
      lStack_40 = 0x20;
    }
    else if (cVar3 == '\x02') {
      pvVar6 = operator_new__((ulong)(uVar9 * 2));
      lStack_40 = 0x28;
    }
    else {
      if (cVar3 != '\x04') {
        if (cVar3 != '\x01') goto LAB_001099a1;
        goto LAB_00109905;
      }
      pvVar6 = operator_new__((ulong)uVar9 << 2);
      lStack_40 = 0x30;
    }
    *(void **)(&__return_storage_ptr__->name_length + lStack_40) = pvVar6;
    std::istream::read((char *)datastream,(long)pvVar6);
    goto LAB_001099a1;
  }
  cVar3 = *pSVar1;
  if (cVar3 == -1) {
LAB_0010992f:
    pvVar6 = operator_new__(1);
    lStack_40 = 0x20;
  }
  else if (cVar3 == '\x02') {
    pvVar6 = operator_new__(2);
    lStack_40 = 0x28;
  }
  else {
    if (cVar3 != '\x04') {
      if (cVar3 != '\x01') goto LAB_001099a1;
      goto LAB_0010992f;
    }
    pvVar6 = operator_new__(4);
    lStack_40 = 0x30;
  }
  *(void **)(&__return_storage_ptr__->name_length + lStack_40) = pvVar6;
  std::istream::read((char *)datastream,(long)pvVar6);
LAB_001099a1:
  std::istream::read((char *)datastream,(long)&__return_storage_ptr__->descr_length);
  if (__return_storage_ptr__->description != (char *)0x0) {
    __assert_fail("result.description == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ORB-HD[P]c3dfile/src/c3dfile.cc"
                  ,0x117,"ParameterInfo C3DFile::readParameterInfo(ifstream &)");
  }
  pcVar4 = (char *)operator_new__((long)__return_storage_ptr__->descr_length + 1);
  __return_storage_ptr__->description = pcVar4;
  std::istream::read((char *)datastream,(long)pcVar4);
  __return_storage_ptr__->description[__return_storage_ptr__->descr_length] = '\0';
  return __return_storage_ptr__;
}

Assistant:

ParameterInfo C3DFile::readParameterInfo (ifstream &datastream) {
	ParameterInfo result;
	datastream.read(reinterpret_cast<char *>(&result), sizeof(Sint8) * 2);
	
	assert(result.name == NULL);
	if (result.name_length < 0) {
		result.name_length *= -1;
		result.locked = true;
	} else {
		result.locked = false;
	}
	result.name = new char[result.name_length + 1];
	datastream.read(result.name, result.name_length);
	result.name[result.name_length] = 0;

	datastream.read(reinterpret_cast<char *>(&result.next_offset), sizeof(Sint16));
	datastream.read(reinterpret_cast<char *>(&result.data_type), sizeof(Uint8));
	datastream.read(reinterpret_cast<char *>(&result.n_dimensions), sizeof(Uint8));

	if (result.n_dimensions > 1) {
		// maximum of 7 dimensions (see c3d UG p. 50)
		assert (result.n_dimensions <= 7);
	}

	result.dimensions = new Uint8[result.n_dimensions];

	int i;

	if (result.n_dimensions == 0) {
		// if dim == 0 the data comes right away
		if (result.data_type == 1 || result.data_type == -1) {
			result.char_data = new char[1];
			datastream.read(reinterpret_cast<char *>(&result.char_data[0]), sizeof(char));
		} else if (result.data_type == 2) {
			result.int_data = new Sint16[1];
			datastream.read(reinterpret_cast<char *>(&result.int_data[0]), sizeof(Sint16));
		} else if (result.data_type == 4) {
			result.float_data = new float[1];
			datastream.read(reinterpret_cast<char *>(&result.float_data[0]), sizeof(float));
		}
	} else {
		// we first have to read out the dimensions of the values and then we can
		// store the values
		int count = 1;
		for (i = 0; i < result.n_dimensions; i++) {
			datastream.read(reinterpret_cast<char *>(&result.dimensions[i]), sizeof(Uint8));
			count *= result.dimensions[i];
		}

		if (result.data_type == 1 || result.data_type == -1) {
			result.char_data = new char[count];
			datastream.read(reinterpret_cast<char *>(&result.char_data[0]), sizeof(char) * count);
		} else if (result.data_type == 2) {
			result.int_data = new Sint16[count];
			datastream.read(reinterpret_cast<char *>(&result.int_data[0]), sizeof(Sint16) * count);
		} else if (result.data_type == 4) {
			result.float_data = new float[count];
			datastream.read(reinterpret_cast<char *>(&result.float_data[0]), sizeof(float) * count);
		}
	}

	datastream.read(reinterpret_cast<char *>(&result.descr_length), sizeof(Uint8));

	assert(result.description == NULL);
	result.description = new char[result.descr_length + 1];
	datastream.read(result.description, result.descr_length);
	result.description[result.descr_length] = 0;

	return result;
}